

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::text_output
               (xml_buffered_writer *writer,char_t *s,chartypex_t type,uint flags)

{
  byte bVar1;
  byte *pbVar2;
  undefined4 in_register_0000000c;
  size_t sVar3;
  void *__buf;
  void *__buf_00;
  int iVar4;
  byte *pbVar5;
  void *pvStack_40;
  
  pvStack_40 = (void *)CONCAT44(in_register_0000000c,flags);
  if ((flags & 0x10) != 0) {
    xml_buffered_writer::write_string(writer,s);
    return;
  }
LAB_0015b4cc:
  do {
    do {
      if (*s == 0) {
        return;
      }
      pbVar2 = (byte *)s + 1;
      do {
        pbVar5 = pbVar2;
        if (((byte)(anonymous_namespace)::chartypex_table[pbVar5[-1]] & type) != 0) {
          pbVar5 = pbVar5 + -1;
          goto LAB_0015b526;
        }
        if (((byte)(anonymous_namespace)::chartypex_table[*pbVar5] & type) != 0) goto LAB_0015b526;
        if (((byte)(anonymous_namespace)::chartypex_table[pbVar5[1]] & type) != 0) {
          pbVar5 = pbVar5 + 1;
          goto LAB_0015b526;
        }
        pbVar2 = pbVar5 + 4;
      } while (((byte)(anonymous_namespace)::chartypex_table[pbVar5[2]] & type) == 0);
      pbVar5 = pbVar5 + 2;
LAB_0015b526:
      xml_buffered_writer::write_buffer(writer,s,(long)pbVar5 - (long)s);
      bVar1 = *pbVar5;
      s = (char_t *)pbVar5;
    } while (bVar1 == 0);
    if (bVar1 == 0x22) {
      if ((flags >> 9 & 1) == 0) {
        iVar4 = 0x71;
        __buf_00 = (void *)0x75;
        pvStack_40 = (void *)0x74;
LAB_0015b601:
        xml_buffered_writer::write(writer,iVar4,__buf_00,(size_t)pvStack_40);
      }
      else {
        iVar4 = 0x22;
LAB_0015b60b:
        xml_buffered_writer::write(writer,iVar4,__buf,(size_t)pvStack_40);
      }
    }
    else {
      if (bVar1 == 0x3e) {
        pvStack_40 = (void *)0x67;
      }
      else {
        if (bVar1 == 0x27) {
          if ((flags >> 9 & 1) != 0) {
            iVar4 = 0x61;
            __buf_00 = (void *)0x70;
            pvStack_40 = (void *)0x73;
            goto LAB_0015b601;
          }
          iVar4 = 0x27;
          goto LAB_0015b60b;
        }
        if (bVar1 != 0x3c) {
          if (bVar1 == 0x26) {
            pvStack_40 = (void *)0x6d;
            xml_buffered_writer::write(writer,0x26,(void *)0x61,0x6d);
            goto LAB_0015b611;
          }
          s = (char_t *)(pbVar5 + 1);
          if ((flags >> 8 & 1) == 0) {
            pvStack_40 = (void *)(ulong)(uint)(int)(char)((char)((ulong)(uint)(int)(char)bVar1 / 10)
                                                         + '0');
            xml_buffered_writer::write(writer,0x26,(void *)0x23,(size_t)pvStack_40);
          }
          goto LAB_0015b4cc;
        }
        pvStack_40 = (void *)0x6c;
      }
      sVar3 = 0x74;
      xml_buffered_writer::write(writer,0x26,pvStack_40,0x74);
      pvStack_40 = (void *)sVar3;
    }
LAB_0015b611:
    s = (char_t *)(pbVar5 + 1);
  } while( true );
}

Assistant:

PUGI_IMPL_FN void text_output(xml_buffered_writer& writer, const char_t* s, chartypex_t type, unsigned int flags)
	{
		if (flags & format_no_escapes)
			writer.write_string(s);
		else
			text_output_escaped(writer, s, type, flags);
	}